

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O1

void encode_field(upb_encstate *e,upb_Message *msg,upb_MiniTableSubInternal *subs,
                 upb_MiniTableField *field)

{
  uint *__src;
  int *piVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  upb_MiniTable *puVar5;
  upb_Map *map;
  upb_Array *arr;
  undefined8 *puVar6;
  uint *puVar7;
  long lVar8;
  char *pcVar9;
  _Bool _Var10;
  size_t sVar11;
  uint32_t tag;
  upb_MiniTable *puVar12;
  uint uVar13;
  ulong uVar14;
  char *val_00;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  bool bVar18;
  upb_StringView key;
  upb_value val;
  upb_MapEntry ent;
  intptr_t iter;
  upb_StringView local_90;
  undefined8 *local_80;
  upb_value local_78;
  anon_union_8_2_9eb4e620_for_upb_Message_0 local_70 [2];
  anon_union_16_3_fdccde34_for_k local_60;
  anon_union_16_3_fdccde34_for_v local_50;
  long local_40;
  intptr_t local_38;
  
  bVar2 = field->mode_dont_copy_me__upb_internal_use_only;
  switch(bVar2 & 3) {
  case 0:
    puVar5 = *subs[field->submsg_index_dont_copy_me__upb_internal_use_only].
              submsg_dont_copy_me__upb_internal_use_only;
    if (puVar5->field_count_dont_copy_me__upb_internal_use_only != 2) {
      __assert_fail("upb_MiniTable_FieldCount(layout) == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/wire/encode.c"
                    ,0x1ba,
                    "void encode_map(upb_encstate *, const upb_Message *, const upb_MiniTableSubInternal *, const upb_MiniTableField *)"
                   );
    }
    map = *(upb_Map **)
           ((long)&msg->field_0 + (ulong)field->offset_dont_copy_me__upb_internal_use_only);
    if (map == (upb_Map *)0x0) {
      return;
    }
    sVar11 = upb_Map_Size(map);
    if (sVar11 == 0) {
      return;
    }
    if ((e->options & 1) == 0) {
      local_38 = -1;
      _Var10 = upb_strtable_next2(&map->table,&local_90,&local_78,&local_38);
      if (!_Var10) {
        return;
      }
      do {
        if ((long)map->key_size != 0) {
          memcpy(&local_60,(void *)CONCAT44(local_90.data._4_4_,(int)local_90.data),
                 (long)map->key_size);
        }
        local_80 = (undefined8 *)local_78.val;
        if ((long)map->val_size == 0) {
          local_50.str.data = (char *)*(undefined8 *)local_78.val;
          local_50.str.size = *(size_t *)(local_78.val + 8);
        }
        else {
          memcpy(&local_50,&local_80,(long)map->val_size);
        }
        encode_mapentry(e,field->number_dont_copy_me__upb_internal_use_only,puVar5,
                        (upb_MapEntry *)local_70);
        _Var10 = upb_strtable_next2(&map->table,&local_90,&local_78,&local_38);
      } while (_Var10);
      return;
    }
    _upb_mapsorter_pushmap
              (&e->sorter,
               (uint)puVar5->fields_dont_copy_me__upb_internal_use_only->
                     descriptortype_dont_copy_me__upb_internal_use_only,map,
               (_upb_sortedmap *)&local_90);
    bVar18 = local_90.data._4_4_ == (int)local_90.size;
    while (!bVar18) {
      puVar6 = (undefined8 *)(e->sorter).entries[local_90.data._4_4_];
      puVar7 = (uint *)*puVar6;
      __src = puVar7 + 1;
      if ((long)map->key_size == 0) {
        local_60.str.size = (size_t)*puVar7;
        local_90.data._4_4_ = local_90.data._4_4_ + 1;
        local_60.str.data = (char *)__src;
      }
      else {
        local_90.data._4_4_ = local_90.data._4_4_ + 1;
        memcpy(&local_60,__src,(long)map->key_size);
      }
      local_80 = (undefined8 *)puVar6[1];
      if ((long)map->val_size == 0) {
        local_50.str.data = (char *)*local_80;
        local_50.str.size = local_80[1];
      }
      else {
        memcpy(&local_50,&local_80,(long)map->val_size);
      }
      if (bVar18) break;
      encode_mapentry(e,field->number_dont_copy_me__upb_internal_use_only,puVar5,
                      (upb_MapEntry *)local_70);
      bVar18 = local_90.data._4_4_ == (int)local_90.size;
    }
    (e->sorter).size = (int)local_90.data;
    return;
  case 1:
    arr = *(upb_Array **)
           ((long)&msg->field_0 + (ulong)field->offset_dont_copy_me__upb_internal_use_only);
    if (arr == (upb_Array *)0x0) {
      return;
    }
    sVar11 = arr->size_dont_copy_me__upb_internal_use_only;
    if (sVar11 == 0) {
      return;
    }
    break;
  case 2:
    encode_scalar(e,(void *)((long)&msg->field_0 +
                            (ulong)field->offset_dont_copy_me__upb_internal_use_only),subs,field);
    return;
  case 3:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/wire/encode.c"
                  ,0x20a,
                  "void encode_field(upb_encstate *, const upb_Message *, const upb_MiniTableSubInternal *, const upb_MiniTableField *)"
                 );
  }
  local_40 = (long)e->ptr - (long)e->limit;
  switch(field->descriptortype_dont_copy_me__upb_internal_use_only) {
  case '\x01':
  case '\x06':
  case '\x10':
    tag = 0;
    if ((bVar2 & 4) == 0) {
      tag = field->number_dont_copy_me__upb_internal_use_only * 8 + 1;
    }
    sVar11 = 8;
    goto LAB_0011e668;
  case '\x02':
  case '\a':
  case '\x0f':
    tag = 0;
    if ((bVar2 & 4) == 0) {
      tag = field->number_dont_copy_me__upb_internal_use_only * 8 + 5;
    }
    sVar11 = 4;
LAB_0011e668:
    encode_fixedarray(e,arr,sVar11,tag);
    break;
  case '\x03':
  case '\x04':
    uVar17 = arr->data_dont_copy_me__upb_internal_use_only;
    uVar16 = 0;
    if ((bVar2 & 4) == 0) {
      uVar16 = field->number_dont_copy_me__upb_internal_use_only << 3;
    }
    lVar15 = sVar11 << 3;
    do {
      uVar14 = *(ulong *)(((uVar17 & 0xfffffffffffffff8) - 8) + lVar15);
      if ((uVar14 < 0x80) && (pcVar9 = e->ptr, pcVar9 != e->buf)) {
        e->ptr = pcVar9 + -1;
        pcVar9[-1] = (char)uVar14;
      }
      else {
        encode_longvarint(e,uVar14);
      }
      if ((ulong)uVar16 != 0) {
        if ((uVar16 < 0x80) && (pcVar9 = e->ptr, pcVar9 != e->buf)) {
          e->ptr = pcVar9 + -1;
          pcVar9[-1] = (char)uVar16;
        }
        else {
          encode_longvarint(e,(ulong)uVar16);
        }
      }
      lVar15 = lVar15 + -8;
    } while (lVar15 != 0);
    break;
  case '\x05':
  case '\x0e':
    uVar17 = arr->data_dont_copy_me__upb_internal_use_only;
    uVar16 = 0;
    if ((bVar2 & 4) == 0) {
      uVar16 = field->number_dont_copy_me__upb_internal_use_only << 3;
    }
    lVar15 = sVar11 << 2;
    do {
      iVar4 = *(int *)(((uVar17 & 0xfffffffffffffff8) - 4) + lVar15);
      if (((ulong)(long)iVar4 < 0x80) && (pcVar9 = e->ptr, pcVar9 != e->buf)) {
        e->ptr = pcVar9 + -1;
        pcVar9[-1] = (char)iVar4;
      }
      else {
        encode_longvarint(e,(long)iVar4);
      }
      if ((ulong)uVar16 != 0) {
        if ((uVar16 < 0x80) && (pcVar9 = e->ptr, pcVar9 != e->buf)) {
          e->ptr = pcVar9 + -1;
          pcVar9[-1] = (char)uVar16;
        }
        else {
          encode_longvarint(e,(ulong)uVar16);
        }
      }
      lVar15 = lVar15 + -4;
    } while (lVar15 != 0);
    break;
  case '\b':
    uVar17 = arr->data_dont_copy_me__upb_internal_use_only;
    uVar16 = 0;
    if ((bVar2 & 4) == 0) {
      uVar16 = field->number_dont_copy_me__upb_internal_use_only << 3;
    }
    do {
      bVar3 = *(byte *)(((uVar17 & 0xfffffffffffffff8) - 1) + sVar11);
      pcVar9 = e->ptr;
      if (pcVar9 == e->buf) {
        encode_longvarint(e,(ulong)bVar3);
      }
      else {
        e->ptr = pcVar9 + -1;
        pcVar9[-1] = bVar3;
      }
      if ((ulong)uVar16 != 0) {
        if ((uVar16 < 0x80) && (pcVar9 = e->ptr, pcVar9 != e->buf)) {
          e->ptr = pcVar9 + -1;
          pcVar9[-1] = (char)uVar16;
        }
        else {
          encode_longvarint(e,(ulong)uVar16);
        }
      }
      sVar11 = sVar11 - 1;
    } while (sVar11 != 0);
    break;
  case '\t':
  case '\f':
    uVar17 = arr->data_dont_copy_me__upb_internal_use_only & 0xfffffffffffffff8;
    lVar15 = sVar11 << 4;
    do {
      encode_bytes(e,*(void **)((uVar17 - 0x10) + lVar15),*(size_t *)((uVar17 - 8) + lVar15));
      uVar14 = *(ulong *)((uVar17 - 8) + lVar15);
      if ((uVar14 < 0x80) && (pcVar9 = e->ptr, pcVar9 != e->buf)) {
        e->ptr = pcVar9 + -1;
        pcVar9[-1] = (char)uVar14;
      }
      else {
        encode_longvarint(e,uVar14);
      }
      uVar16 = field->number_dont_copy_me__upb_internal_use_only * 8 + 2;
      if ((field->number_dont_copy_me__upb_internal_use_only << 3 < 0x80) &&
         (pcVar9 = e->ptr, pcVar9 != e->buf)) {
        e->ptr = pcVar9 + -1;
        pcVar9[-1] = (char)uVar16;
      }
      else {
        encode_longvarint(e,(ulong)uVar16);
      }
      lVar15 = lVar15 + -0x10;
    } while (lVar15 != 0);
    return;
  case '\n':
    uVar17 = arr->data_dont_copy_me__upb_internal_use_only;
    puVar5 = *subs[field->submsg_index_dont_copy_me__upb_internal_use_only].
              submsg_dont_copy_me__upb_internal_use_only;
    piVar1 = &e->depth;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
LAB_0011ed3a:
      encode_err(e,kUpb_EncodeStatus_MaxDepthExceeded);
    }
    lVar15 = sVar11 << 3;
    do {
      uVar16 = field->number_dont_copy_me__upb_internal_use_only * 8 + 4;
      if ((field->number_dont_copy_me__upb_internal_use_only << 3 < 0x80) &&
         (pcVar9 = e->ptr, pcVar9 != e->buf)) {
        e->ptr = pcVar9 + -1;
        pcVar9[-1] = (char)uVar16;
      }
      else {
        encode_longvarint(e,(ulong)uVar16);
      }
      uVar14 = *(ulong *)(((uVar17 & 0xfffffffffffffff8) - 8) + lVar15);
      puVar12 = puVar5;
      if ((uVar14 & 1) != 0) {
        puVar12 = &_kUpb_MiniTable_Empty_dont_copy_me__upb_internal_use_only;
      }
      encode_message(e,(upb_Message *)(uVar14 & 0xfffffffffffffffe),puVar12,
                     &local_70[0].internal_opaque);
      uVar16 = field->number_dont_copy_me__upb_internal_use_only * 8 + 3;
      if ((field->number_dont_copy_me__upb_internal_use_only << 3 < 0x80) &&
         (pcVar9 = e->ptr, pcVar9 != e->buf)) {
        e->ptr = pcVar9 + -1;
        pcVar9[-1] = (char)uVar16;
      }
      else {
        encode_longvarint(e,(ulong)uVar16);
      }
      lVar15 = lVar15 + -8;
    } while (lVar15 != 0);
    goto LAB_0011ebc9;
  case '\v':
    uVar17 = arr->data_dont_copy_me__upb_internal_use_only;
    puVar5 = *subs[field->submsg_index_dont_copy_me__upb_internal_use_only].
              submsg_dont_copy_me__upb_internal_use_only;
    piVar1 = &e->depth;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) goto LAB_0011ed3a;
    lVar15 = sVar11 << 3;
    do {
      uVar14 = *(ulong *)(((uVar17 & 0xfffffffffffffff8) - 8) + lVar15);
      puVar12 = puVar5;
      if ((uVar14 & 1) != 0) {
        puVar12 = &_kUpb_MiniTable_Empty_dont_copy_me__upb_internal_use_only;
      }
      encode_message(e,(upb_Message *)(uVar14 & 0xfffffffffffffffe),puVar12,
                     &local_70[0].internal_opaque);
      if (((ulong)local_70[0] < 0x80) && (pcVar9 = e->ptr, pcVar9 != e->buf)) {
        e->ptr = pcVar9 + -1;
        pcVar9[-1] = (char)local_70[0].internal_opaque;
      }
      else {
        encode_longvarint(e,local_70[0].internal_opaque);
      }
      uVar16 = field->number_dont_copy_me__upb_internal_use_only * 8 + 2;
      if ((field->number_dont_copy_me__upb_internal_use_only << 3 < 0x80) &&
         (pcVar9 = e->ptr, pcVar9 != e->buf)) {
        e->ptr = pcVar9 + -1;
        pcVar9[-1] = (char)uVar16;
      }
      else {
        encode_longvarint(e,(ulong)uVar16);
      }
      lVar15 = lVar15 + -8;
    } while (lVar15 != 0);
LAB_0011ebc9:
    e->depth = e->depth + 1;
    return;
  case '\r':
    uVar17 = arr->data_dont_copy_me__upb_internal_use_only;
    uVar16 = 0;
    if ((bVar2 & 4) == 0) {
      uVar16 = field->number_dont_copy_me__upb_internal_use_only << 3;
    }
    lVar15 = sVar11 << 2;
    do {
      uVar13 = *(uint *)(((uVar17 & 0xfffffffffffffff8) - 4) + lVar15);
      if (((ulong)uVar13 < 0x80) && (pcVar9 = e->ptr, pcVar9 != e->buf)) {
        e->ptr = pcVar9 + -1;
        pcVar9[-1] = (char)uVar13;
      }
      else {
        encode_longvarint(e,(ulong)uVar13);
      }
      if ((ulong)uVar16 != 0) {
        if ((uVar16 < 0x80) && (pcVar9 = e->ptr, pcVar9 != e->buf)) {
          e->ptr = pcVar9 + -1;
          pcVar9[-1] = (char)uVar16;
        }
        else {
          encode_longvarint(e,(ulong)uVar16);
        }
      }
      lVar15 = lVar15 + -4;
    } while (lVar15 != 0);
    break;
  case '\x11':
    uVar17 = arr->data_dont_copy_me__upb_internal_use_only;
    uVar16 = 0;
    if ((bVar2 & 4) == 0) {
      uVar16 = field->number_dont_copy_me__upb_internal_use_only << 3;
    }
    lVar15 = sVar11 << 2;
    do {
      iVar4 = *(int *)(((uVar17 & 0xfffffffffffffff8) - 4) + lVar15);
      uVar13 = iVar4 >> 0x1f ^ iVar4 * 2;
      if ((uVar13 < 0x80) && (pcVar9 = e->ptr, pcVar9 != e->buf)) {
        e->ptr = pcVar9 + -1;
        pcVar9[-1] = (char)uVar13;
      }
      else {
        encode_longvarint(e,(ulong)uVar13);
      }
      if ((ulong)uVar16 != 0) {
        if ((uVar16 < 0x80) && (pcVar9 = e->ptr, pcVar9 != e->buf)) {
          e->ptr = pcVar9 + -1;
          pcVar9[-1] = (char)uVar16;
        }
        else {
          encode_longvarint(e,(ulong)uVar16);
        }
      }
      lVar15 = lVar15 + -4;
    } while (lVar15 != 0);
    break;
  case '\x12':
    uVar17 = arr->data_dont_copy_me__upb_internal_use_only;
    uVar16 = 0;
    if ((bVar2 & 4) == 0) {
      uVar16 = field->number_dont_copy_me__upb_internal_use_only << 3;
    }
    lVar15 = sVar11 << 3;
    do {
      lVar8 = *(long *)(((uVar17 & 0xfffffffffffffff8) - 8) + lVar15);
      uVar14 = lVar8 >> 0x3f ^ lVar8 * 2;
      if ((uVar14 < 0x80) && (pcVar9 = e->ptr, pcVar9 != e->buf)) {
        e->ptr = pcVar9 + -1;
        pcVar9[-1] = (char)uVar14;
      }
      else {
        encode_longvarint(e,uVar14);
      }
      if ((ulong)uVar16 != 0) {
        if ((uVar16 < 0x80) && (pcVar9 = e->ptr, pcVar9 != e->buf)) {
          e->ptr = pcVar9 + -1;
          pcVar9[-1] = (char)uVar16;
        }
        else {
          encode_longvarint(e,(ulong)uVar16);
        }
      }
      lVar15 = lVar15 + -8;
    } while (lVar15 != 0);
  }
  if ((bVar2 & 4) != 0) {
    pcVar9 = e->ptr;
    val_00 = e->limit + (local_40 - (long)pcVar9);
    if ((val_00 < (char *)0x80) && (pcVar9 != e->buf)) {
      e->ptr = pcVar9 + -1;
      pcVar9[-1] = (char)val_00;
    }
    else {
      encode_longvarint(e,(uint64_t)val_00);
    }
    uVar16 = field->number_dont_copy_me__upb_internal_use_only * 8 + 2;
    if ((0x7f < field->number_dont_copy_me__upb_internal_use_only << 3) ||
       (pcVar9 = e->ptr, pcVar9 == e->buf)) {
      encode_longvarint(e,(ulong)uVar16);
      return;
    }
    e->ptr = pcVar9 + -1;
    pcVar9[-1] = (char)uVar16;
  }
  return;
}

Assistant:

static void encode_field(upb_encstate* e, const upb_Message* msg,
                         const upb_MiniTableSubInternal* subs,
                         const upb_MiniTableField* field) {
  switch (UPB_PRIVATE(_upb_MiniTableField_Mode)(field)) {
    case kUpb_FieldMode_Array:
      encode_array(e, msg, subs, field);
      break;
    case kUpb_FieldMode_Map:
      encode_map(e, msg, subs, field);
      break;
    case kUpb_FieldMode_Scalar:
      encode_scalar(e, UPB_PTR_AT(msg, field->UPB_PRIVATE(offset), void), subs,
                    field);
      break;
    default:
      UPB_UNREACHABLE();
  }
}